

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

char * __thiscall QFileSystemModelPrivate::index(QFileSystemModelPrivate *this,char *__s,int __c)

{
  int iVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  uint uVar10;
  undefined4 in_ECX;
  undefined4 in_register_00000014;
  char *pcVar11;
  long lVar12;
  QStringView QVar13;
  
  pcVar11 = (char *)CONCAT44(in_register_00000014,__c);
  if (pcVar11 == (char *)0x0) {
    lVar12 = 0;
  }
  else {
    lVar12 = *(long *)(pcVar11 + 0x40);
  }
  if ((__s + 0x138 == pcVar11 || lVar12 == 0) || (pcVar11[0x4d] == '\0')) {
    *(undefined8 *)this = 0xffffffffffffffff;
    *(undefined8 *)&this->field_0x8 = 0;
    *(undefined8 *)&this->field_0x10 = 0;
  }
  else {
    cVar2 = __s[8];
    cVar3 = __s[9];
    cVar4 = __s[10];
    cVar5 = __s[0xb];
    cVar6 = __s[0xc];
    cVar7 = __s[0xd];
    cVar8 = __s[0xe];
    cVar9 = __s[0xf];
    QVar13.m_data = *(storage_type_conflict **)(pcVar11 + 8);
    QVar13.m_size = *(qsizetype *)(pcVar11 + 0x10);
    uVar10 = QtPrivate::QStringList_indexOf
                       ((QList_conflict *)(lVar12 + 0x20),QVar13,0,CaseSensitive);
    if (*(int *)(__s + 0x1ac) != 0) {
      iVar1 = *(int *)(lVar12 + 0x48);
      if (iVar1 == -1) {
        uVar10 = ~uVar10 + *(int *)(lVar12 + 0x30);
      }
      else if ((int)uVar10 < iVar1) {
        uVar10 = iVar1 + ~uVar10;
      }
    }
    *(uint *)this = uVar10;
    *(undefined4 *)&this->field_0x4 = in_ECX;
    *(char **)&this->field_0x8 = pcVar11;
    this->field_0x10 = cVar2;
    this->field_0x11 = cVar3;
    this->field_0x12 = cVar4;
    this->field_0x13 = cVar5;
    this->field_0x14 = cVar6;
    this->field_0x15 = cVar7;
    this->field_0x16 = cVar8;
    this->field_0x17 = cVar9;
  }
  return (char *)this;
}

Assistant:

QModelIndex QFileSystemModelPrivate::index(const QFileSystemModelPrivate::QFileSystemNode *node, int column) const
{
    Q_Q(const QFileSystemModel);
    QFileSystemModelPrivate::QFileSystemNode *parentNode = (node ? node->parent : nullptr);
    if (node == &root || !parentNode)
        return QModelIndex();

    // get the parent's row
    Q_ASSERT(node);
    if (!node->isVisible)
        return QModelIndex();

    int visualRow = translateVisibleLocation(parentNode, parentNode->visibleLocation(node->fileName));
    return q->createIndex(visualRow, column, const_cast<QFileSystemNode*>(node));
}